

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void Curl_cpool_disconnect(Curl_easy *data,connectdata *conn,_Bool aborted)

{
  byte bVar1;
  Curl_share *pCVar2;
  curl_trc_feat *pcVar3;
  byte bVar4;
  _Bool aborted_00;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  Curl_multi *pCVar8;
  cpool *cpool;
  
  if (data != (Curl_easy *)0x0) {
    pCVar2 = data->share;
    if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x20) == 0)) {
      pCVar8 = data->multi_easy;
      if ((pCVar8 == (Curl_multi *)0x0) && (pCVar8 = data->multi, pCVar8 == (Curl_multi *)0x0)) {
        return;
      }
      cpool = &pCVar8->cpool;
    }
    else {
      cpool = &pCVar2->cpool;
    }
    sVar6 = Curl_llist_count(&conn->easyq);
    if (sVar6 == 0 || aborted) {
      bVar1 = cpool->field_0x98;
      if ((bVar1 & 1) == 0) {
        bVar4 = bVar1;
        if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
          Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
          bVar4 = cpool->field_0x98;
        }
        cpool->field_0x98 = bVar4 | 1;
      }
      if (((conn->bits).field_0x4 & 2) != 0) {
        cpool_remove_conn(cpool,conn);
      }
      aborted_00 = (*cpool->disconnect_cb)(data,conn,aborted);
      pCVar8 = data->multi;
      uVar5 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
      if (pCVar8 == (Curl_multi *)0x0) {
        if (((uVar5 >> 0x1c & 1) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"closing connection #%ld",conn->connection_id);
        }
        cpool_close_and_destroy((cpool *)0x0,conn,data,!aborted_00);
      }
      else {
        if (((uVar5 >> 0x1c & 1) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          pcVar7 = "shutting down";
          if (aborted_00) {
            pcVar7 = "closing";
          }
          Curl_infof(data,"%s connection #%ld",pcVar7,conn->connection_id);
          pCVar8 = data->multi;
        }
        cpool_discard_conn(&pCVar8->cpool,data,conn,aborted_00);
      }
      if ((bVar1 & 1) == 0) {
        cpool->field_0x98 = cpool->field_0x98 & 0xfe;
        if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
          Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_cpool_disconnect(struct Curl_easy *data,
                           struct connectdata *conn,
                           bool aborted)
{
  struct cpool *cpool = cpool_get_instance(data);
  bool do_lock;

  DEBUGASSERT(cpool);
  DEBUGASSERT(data && !data->conn);
  if(!cpool)
    return;

  /* If this connection is not marked to force-close, leave it open if there
   * are other users of it */
  if(CONN_INUSE(conn) && !aborted) {
    DEBUGASSERT(0); /* does this ever happen? */
    DEBUGF(infof(data, "Curl_disconnect when inuse: %zu", CONN_INUSE(conn)));
    return;
  }

  /* This method may be called while we are under lock, e.g. from a
   * user callback in find. */
  do_lock = !CPOOL_IS_LOCKED(cpool);
  if(do_lock)
    CPOOL_LOCK(cpool);

  if(conn->bits.in_cpool) {
    cpool_remove_conn(cpool, conn);
    DEBUGASSERT(!conn->bits.in_cpool);
  }

  /* Run the callback to let it clean up anything it wants to. */
  aborted = cpool->disconnect_cb(data, conn, aborted);

  if(data->multi) {
    /* Add it to the multi's cpool for shutdown handling */
    infof(data, "%s connection #%" FMT_OFF_T,
          aborted? "closing" : "shutting down", conn->connection_id);
    cpool_discard_conn(&data->multi->cpool, data, conn, aborted);
  }
  else {
    /* No multi available. Make a best-effort shutdown + close */
    infof(data, "closing connection #%" FMT_OFF_T, conn->connection_id);
    cpool_close_and_destroy(NULL, conn, data, !aborted);
  }

  if(do_lock)
    CPOOL_UNLOCK(cpool);
}